

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_freqt(HTS_Vocoder *v,double *c1,int m1,double *c2,int m2,double a)

{
  double dVar1;
  double dVar2;
  void *pvVar3;
  long lVar4;
  double *a_00;
  double *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  double in_XMM0_Qa;
  double size;
  double *g;
  double b;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar6;
  
  size = -in_XMM0_Qa * in_XMM0_Qa + 1.0;
  if (*(ulong *)(in_RDI + 0x80) < (ulong)(long)in_R8D) {
    if (*(long *)(in_RDI + 0x78) != 0) {
      HTS_free((void *)0x19d5e8);
    }
    pvVar3 = HTS_calloc(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),(size_t)size);
    *(void **)(in_RDI + 0x78) = pvVar3;
    *(long *)(in_RDI + 0x80) = (long)in_R8D;
  }
  lVar4 = *(long *)(in_RDI + 0x78) + *(long *)(in_RDI + 0x80) * 8;
  a_00 = (double *)(lVar4 + 8);
  for (iVar6 = 0; iVar6 < in_R8D + 1; iVar6 = iVar6 + 1) {
    a_00[iVar6] = 0.0;
  }
  for (iVar6 = -in_EDX; iVar6 < 1; iVar6 = iVar6 + 1) {
    if (-1 < in_R8D) {
      dVar1 = *(double *)(in_RSI + (long)-iVar6 * 8);
      dVar2 = *a_00;
      **(double **)(in_RDI + 0x78) = dVar2;
      *a_00 = in_XMM0_Qa * dVar2 + dVar1;
    }
    if (0 < in_R8D) {
      dVar1 = **(double **)(in_RDI + 0x78);
      dVar2 = *(double *)(lVar4 + 0x10);
      *(double *)(*(long *)(in_RDI + 0x78) + 8) = dVar2;
      *(double *)(lVar4 + 0x10) = size * dVar1 + in_XMM0_Qa * dVar2;
    }
    for (iVar5 = 2; iVar5 <= in_R8D; iVar5 = iVar5 + 1) {
      dVar1 = *(double *)(*(long *)(in_RDI + 0x78) + (long)(iVar5 + -1) * 8);
      dVar2 = a_00[iVar5];
      *(double *)(*(long *)(in_RDI + 0x78) + (long)iVar5 * 8) = dVar2;
      a_00[iVar5] = in_XMM0_Qa * (dVar2 - a_00[iVar5 + -1]) + dVar1;
    }
  }
  HTS_movem(a_00,in_RCX,in_R8D + 1);
  return;
}

Assistant:

static void HTS_freqt(HTS_Vocoder * v, const double *c1, const int m1, double *c2, const int m2, const double a)
{
   int i, j;
   const double b = 1 - a * a;
   double *g;

   if (m2 > v->freqt_size) {
      if (v->freqt_buff != NULL)
         HTS_free(v->freqt_buff);
      v->freqt_buff = (double *) HTS_calloc(m2 + m2 + 2, sizeof(double));
      v->freqt_size = m2;
   }
   g = v->freqt_buff + v->freqt_size + 1;

   for (i = 0; i < m2 + 1; i++)
      g[i] = 0.0;

   for (i = -m1; i <= 0; i++) {
      if (0 <= m2)
         g[0] = c1[-i] + a * (v->freqt_buff[0] = g[0]);
      if (1 <= m2)
         g[1] = b * v->freqt_buff[0] + a * (v->freqt_buff[1] = g[1]);
      for (j = 2; j <= m2; j++)
         g[j] = v->freqt_buff[j - 1] + a * ((v->freqt_buff[j] = g[j]) - g[j - 1]);
   }

   HTS_movem(g, c2, m2 + 1);
}